

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O0

int Abc_SuppFindVar(Vec_Wec_t *pS,Vec_Wec_t *pD,int nVars)

{
  int iVar1;
  int local_28;
  int local_24;
  int dBest;
  int vBest;
  int v;
  int nVars_local;
  Vec_Wec_t *pD_local;
  Vec_Wec_t *pS_local;
  
  local_24 = -1;
  local_28 = -1;
  for (dBest = 0; dBest < nVars; dBest = dBest + 1) {
    iVar1 = Vec_WecLevelSize(pS,dBest);
    if ((iVar1 == 0) && ((local_24 == -1 || (iVar1 = Vec_WecLevelSize(pD,dBest), iVar1 < local_28)))
       ) {
      local_24 = dBest;
      local_28 = Vec_WecLevelSize(pD,dBest);
    }
  }
  return local_24;
}

Assistant:

int Abc_SuppFindVar( Vec_Wec_t * pS, Vec_Wec_t * pD, int nVars )
{
    int v, vBest = -1, dBest = -1;
    for ( v = 0; v < nVars; v++ )
    {
        if ( Vec_WecLevelSize(pS, v) )
            continue;
        if ( vBest == -1 || dBest > Vec_WecLevelSize(pD, v) )
            vBest = v, dBest = Vec_WecLevelSize(pD, v);
    }
    return vBest;
}